

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererParallelTests.cpp
# Opt level: O3

void __thiscall
agge::tests::RendererParallelTests::RendererPopulatesBitmapWithMaskDataAccordingToWindow
          (RendererParallelTests *this)

{
  void *pvVar1;
  raw_memory_object *prVar2;
  raw_memory_object *prVar3;
  undefined8 *puVar4;
  long lVar5;
  blender<unsigned_char,_unsigned_char> blender1;
  uint8_t reference1 [44];
  mask_full<8UL> mask1;
  cell cells4 [2];
  cell cells3 [2];
  renderer_parallel r;
  rect_i window1;
  scanline_cells cells [4];
  bitmap<unsigned_char,_0UL,_0UL> local_228;
  blender<unsigned_char,_unsigned_char> local_208;
  undefined8 local_1e8;
  uchar auStack_1e0 [40];
  string local_1b8;
  LocationInfo local_198;
  mask_full<8UL> local_170;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined1 local_130 [8];
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined1 local_110 [8];
  renderer_parallel local_108;
  rect_i local_d8;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  cell local_a4;
  undefined1 local_98 [16];
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  cell local_74;
  pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*> local_68;
  undefined8 *local_58;
  cell *local_50;
  undefined8 *local_48;
  undefined1 *local_40;
  undefined8 *local_38;
  undefined1 *local_30;
  
  local_68.second = &local_74;
  local_98._0_8_ = 0;
  local_88 = 0;
  uStack_7c = 0;
  local_98._8_8_ = 0x300000011;
  uStack_84 = 0xfffffffd;
  uStack_80 = 7;
  local_78 = 0xfffffff2;
  local_50 = &local_a4;
  local_b8 = 0;
  uStack_ac = 0;
  local_c8 = 6;
  uStack_c0 = 0x9000000ab;
  uStack_b4 = 0xffffffe2;
  uStack_b0 = 10;
  local_a8 = 0xffffff73;
  local_40 = local_110;
  local_128 = 1;
  uStack_120 = 0x9000000a0;
  local_118 = 0xffffff6000000000;
  local_30 = local_130;
  local_138 = 0xfffffff000000000;
  local_148 = 1;
  uStack_140 = 0x900000010;
  local_68.first = (cell *)local_98;
  local_58 = &local_c8;
  local_48 = &local_128;
  local_38 = &local_148;
  mocks::mask<8ul>::
  mask<std::pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>,4>
            ((mask<8ul> *)&local_170,
             (pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*> (*) [4])
             &local_68,3);
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x2c);
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start + 0x2c;
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1c] = '\0';
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1d] = '\0';
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1e] = '\0';
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1f] = '\0';
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x20] = '\0';
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x21] = '\0';
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x22] = '\0';
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x23] = '\0';
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x24] = '\0';
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x25] = '\0';
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x26] = '\0';
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x27] = '\0';
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x28] = '\0';
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x29] = '\0';
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x2a] = '\0';
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x2b] = '\0';
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x10] = '\0';
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x11] = '\0';
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x12] = '\0';
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x13] = '\0';
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x14] = '\0';
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x15] = '\0';
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x16] = '\0';
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x17] = '\0';
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x18] = '\0';
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x19] = '\0';
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1a] = '\0';
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1b] = '\0';
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1c] = '\0';
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1d] = '\0';
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1e] = '\0';
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1f] = '\0';
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0] = '\0';
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[1] = '\0';
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[2] = '\0';
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[3] = '\0';
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[4] = '\0';
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[5] = '\0';
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[6] = '\0';
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[7] = '\0';
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[8] = '\0';
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[9] = '\0';
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[10] = '\0';
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xb] = '\0';
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xc] = '\0';
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xd] = '\0';
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xe] = '\0';
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xf] = '\0';
  local_228._width = 0xb;
  local_228._height = 4;
  local_208.filling_log.
  super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_208.filling_log.
  super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_208.filling_log.
  super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  puVar4 = (undefined8 *)operator_new__(0x28);
  *puVar4 = 2;
  local_108._scanline_caches = (raw_memory_object *)(puVar4 + 1);
  puVar4[1] = 0;
  *(undefined4 *)(puVar4 + 2) = 0;
  puVar4[3] = 0;
  *(undefined4 *)(puVar4 + 4) = 0;
  parallel::parallel(&local_108._parallel,2);
  local_108._parallelism = 2;
  local_d8.x1 = 5;
  local_d8.y1 = 3;
  local_d8.x2 = 7;
  local_d8.y2 = 6;
  renderer_parallel::operator()
            (&local_108,&local_228,(vector_i)0x3ffffffff,&local_d8,&local_170,&local_208,
             (simple_alpha<unsigned_char,_8UL> *)&local_1e8);
  auStack_1e0[0] = '\0';
  auStack_1e0[1] = '\0';
  auStack_1e0[2] = '\0';
  auStack_1e0[3] = '\0';
  auStack_1e0[4] = '\0';
  auStack_1e0[5] = '\0';
  auStack_1e0[6] = '\0';
  auStack_1e0[7] = '\0';
  auStack_1e0[0x10] = '\0';
  auStack_1e0[0x11] = '\0';
  auStack_1e0[0x12] = '\0';
  auStack_1e0[0x13] = '\0';
  auStack_1e0[0x16] = '\0';
  auStack_1e0[0x17] = '\0';
  auStack_1e0[0x18] = '\0';
  auStack_1e0[0x19] = '\0';
  auStack_1e0[0x1a] = '\0';
  auStack_1e0[0x1b] = '\0';
  auStack_1e0[0x1c] = '\0';
  auStack_1e0[0x1d] = '\0';
  auStack_1e0[0x1e] = '\0';
  auStack_1e0[0x1f] = '\0';
  auStack_1e0[0x20] = '\0';
  auStack_1e0[0x21] = '\0';
  auStack_1e0[0x22] = '\0';
  auStack_1e0[0x23] = '\0';
  local_1e8._0_1_ = '\0';
  local_1e8._1_1_ = '\0';
  local_1e8._2_1_ = '\0';
  local_1e8._3_1_ = '\0';
  local_1e8._4_1_ = '\0';
  local_1e8._5_1_ = '\0';
  local_1e8._6_1_ = '\x0e';
  local_1e8._7_1_ = '\x0e';
  auStack_1e0[8] = '\0';
  auStack_1e0[9] = '\0';
  auStack_1e0[10] = 0xab;
  auStack_1e0[0xb] = '\0';
  auStack_1e0[0xc] = '\0';
  auStack_1e0[0xd] = '\0';
  auStack_1e0[0xe] = '\0';
  auStack_1e0[0xf] = '\0';
  auStack_1e0[0x14] = 0xa0;
  auStack_1e0[0x15] = 0xa0;
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1b8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererParallelTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_198,&local_1b8,0xd5);
  ut::are_equal<unsigned_char,44ul,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((uchar (*) [44])&local_1e8,&local_228.data,&local_198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198.filename._M_dataplus._M_p != &local_198.filename.field_2) {
    operator_delete(local_198.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  prVar3 = local_108._scanline_caches;
  if (local_108._scanline_caches != (raw_memory_object *)0x0) {
    prVar2 = local_108._scanline_caches + -1;
    if (*(long *)&local_108._scanline_caches[-1]._size != 0) {
      lVar5 = *(long *)&local_108._scanline_caches[-1]._size << 4;
      do {
        pvVar1 = *(void **)((long)&prVar3[-1]._buffer + lVar5);
        if (pvVar1 != (void *)0x0) {
          operator_delete__(pvVar1);
        }
        lVar5 = lVar5 + -0x10;
      } while (lVar5 != 0);
    }
    operator_delete__(&prVar2->_size);
  }
  parallel::~parallel(&local_108._parallel);
  if (local_208.filling_log.
      super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_208.filling_log.
                    super__Vector_base<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry,_std::allocator<agge::tests::mocks::blender<unsigned_char,_unsigned_char>::fill_log_entry>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_228.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_170.super_mask<8UL>._cells.
      super__Vector_base<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_170.super_mask<8UL>._cells.
                    super__Vector_base<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

test( RendererPopulatesBitmapWithMaskDataAccordingToWindow )
			{
				// INIT
				const mocks::cell cells1[] = { { 0, 0, 0x11 }, { 3, 0, -0x03 }, { 7, 0, -0x0E }, };
				const mocks::cell cells2[] = { { 6, 0, 0xAB }, { 9, 0, -0x1E }, { 10, 0, -0x8D }, };
				const mocks::cell cells3[] = { { 1, 0, 0xA0 }, { 9, 0, -0xA0 }, };
				const mocks::cell cells4[] = { { 1, 0, 0x10 }, { 9, 0, -0x10 }, };
				const mocks::mask<8>::scanline_cells cells[] = {
					make_pair(begin(cells1), end(cells1)),
					make_pair(begin(cells2), end(cells2)),
					make_pair(begin(cells3), end(cells3)),
					make_pair(begin(cells4), end(cells4)),
				};
				const mocks::mask_full<8> mask1(cells, 3);
				mocks::bitmap<uint8_t> bitmap1(11, 4);
				mocks::blender<uint8_t, uint8_t> blender1;

				renderer_parallel r(2);

				// ACT
				const rect_i window1 = { 5, 3, 7, 6 };
				r(bitmap1, mkvector(-1, 3), &window1, mask1, blender1, mocks::simple_alpha<uint8_t, 8>());

				// ASSERT
				uint8_t reference1[] = {
					0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x0E, 0x0E, 0x00, 0x00, 0x00,
					0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0xAB, 0x00, 0x00, 0x00,
					0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0xA0, 0xA0, 0x00, 0x00, 0x00,
					0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
				};

				assert_equal(reference1, bitmap1.data);
			}